

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupConeSupp(Gia_Man_t *p,int iLit,Vec_Int_t *vCiIds)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  char *pcVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vObjs;
  int *piVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar2 = (uint)iLit >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar2) {
LAB_001e4cd2:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar3 = p->pObjs;
  vObjs = (Vec_Int_t *)malloc(0x10);
  vObjs->nCap = 1000;
  vObjs->nSize = 0;
  piVar8 = (int *)malloc(4000);
  vObjs->pArray = piVar8;
  if ((p->vCopies).nSize < iVar1) {
    Vec_IntFillExtra(&p->vCopies,iVar1,-1);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  if (0 < vCiIds->nSize) {
    lVar12 = 0;
    do {
      iVar1 = vCiIds->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->vCis->nSize <= iVar1)) goto LAB_001e4cf1;
      iVar1 = p->vCis->pArray[iVar1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e4cd2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001e4d10:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001e4d10;
      if ((p->vCopies).nSize <= iVar1) goto LAB_001e4d2f;
      (p->vCopies).pArray[iVar1] = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCiIds->nSize);
  }
  Gia_ManDupConeSupp_rec(p_00,p,pGVar3 + uVar2,vObjs);
  if ((p->vCopies).nSize <= (int)uVar2) {
LAB_001e4cf1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = (p->vCopies).pArray[uVar2];
  if ((int)uVar2 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  Gia_ManAppendCo(p_00,uVar2 ^ iLit & 1U);
  if (0 < vCiIds->nSize) {
    piVar8 = vCiIds->pArray;
    pVVar7 = p->vCis;
    lVar12 = 0;
    do {
      iVar1 = piVar8[lVar12];
      if (((long)iVar1 < 0) || (pVVar7->nSize <= iVar1)) goto LAB_001e4cf1;
      iVar1 = pVVar7->pArray[iVar1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e4cd2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar1) goto LAB_001e4d2f;
      (p->vCopies).pArray[iVar1] = -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCiIds->nSize);
  }
  if (0 < vObjs->nSize) {
    piVar8 = vObjs->pArray;
    lVar12 = 0;
    do {
      iVar1 = piVar8[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e4cd2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar1) {
LAB_001e4d2f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar1] = -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vObjs->nSize);
  }
  if (vObjs->pArray != (int *)0x0) {
    free(vObjs->pArray);
    vObjs->pArray = (int *)0x0;
  }
  free(vObjs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupConeSupp( Gia_Man_t * p, int iLit, Vec_Int_t * vCiIds )
{
    Gia_Man_t * pNew; int i, iLit0;
    Gia_Obj_t * pObj, * pRoot = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    Vec_Int_t * vObjs = Vec_IntAlloc( 1000 );
    //assert( Gia_ObjIsAnd(pRoot) );
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    Gia_ManDupConeSupp_rec( pNew, p, pRoot, vObjs );
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    Gia_ManAppendCo( pNew, iLit0 );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Vec_IntFree( vObjs );
    //assert( Vec_IntCountLarger(&p->vCopies, -1) == 0 );
    return pNew;
}